

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_service.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::ServiceGenerator::GenerateImplementation
          (ServiceGenerator *this,Printer *printer)

{
  Formatter format;
  Formatter local_50;
  
  local_50.printer_ = printer;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_Rb_tree(&local_50.vars_._M_t,&(this->vars_)._M_t);
  Formatter::operator()
            (&local_50,
             "$classname$::~$classname$() {}\n\nconst ::$proto_ns$::ServiceDescriptor* $classname$::descriptor() {\n  ::$proto_ns$::internal::AssignDescriptors(&$desc_table$);\n  return $file_level_service_descriptors$[$1$];\n}\n\nconst ::$proto_ns$::ServiceDescriptor* $classname$::GetDescriptor() {\n  return descriptor();\n}\n\n"
             ,&this->index_in_metadata_);
  GenerateNotImplementedMethods(this,printer);
  GenerateCallMethod(this,printer);
  GenerateGetPrototype(this,REQUEST,printer);
  GenerateGetPrototype(this,RESPONSE,printer);
  Formatter::operator()<>
            (&local_50,
             "$classname$_Stub::$classname$_Stub(::$proto_ns$::RpcChannel* channel)\n  : channel_(channel), owns_channel_(false) {}\n$classname$_Stub::$classname$_Stub(\n    ::$proto_ns$::RpcChannel* channel,\n    ::$proto_ns$::Service::ChannelOwnership ownership)\n  : channel_(channel),\n    owns_channel_(ownership == ::$proto_ns$::Service::STUB_OWNS_CHANNEL) {}\n$classname$_Stub::~$classname$_Stub() {\n  if (owns_channel_) delete channel_;\n}\n\n"
            );
  GenerateStubMethods(this,printer);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_50.vars_._M_t);
  return;
}

Assistant:

void ServiceGenerator::GenerateImplementation(io::Printer* printer) {
  Formatter format(printer, vars_);
  format(
      "$classname$::~$classname$() {}\n"
      "\n"
      "const ::$proto_ns$::ServiceDescriptor* $classname$::descriptor() {\n"
      "  "
      "::$proto_ns$::internal::AssignDescriptors(&$desc_table$);\n"
      "  return $file_level_service_descriptors$[$1$];\n"
      "}\n"
      "\n"
      "const ::$proto_ns$::ServiceDescriptor* $classname$::GetDescriptor() {\n"
      "  return descriptor();\n"
      "}\n"
      "\n",
      index_in_metadata_);

  // Generate methods of the interface.
  GenerateNotImplementedMethods(printer);
  GenerateCallMethod(printer);
  GenerateGetPrototype(REQUEST, printer);
  GenerateGetPrototype(RESPONSE, printer);

  // Generate stub implementation.
  format(
      "$classname$_Stub::$classname$_Stub(::$proto_ns$::RpcChannel* channel)\n"
      "  : channel_(channel), owns_channel_(false) {}\n"
      "$classname$_Stub::$classname$_Stub(\n"
      "    ::$proto_ns$::RpcChannel* channel,\n"
      "    ::$proto_ns$::Service::ChannelOwnership ownership)\n"
      "  : channel_(channel),\n"
      "    owns_channel_(ownership == "
      "::$proto_ns$::Service::STUB_OWNS_CHANNEL) "
      "{}\n"
      "$classname$_Stub::~$classname$_Stub() {\n"
      "  if (owns_channel_) delete channel_;\n"
      "}\n"
      "\n");

  GenerateStubMethods(printer);
}